

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void erase_lots(Terminal *term,_Bool line_only,_Bool from_begin,_Bool to_end)

{
  bool bVar1;
  wchar_t wVar2;
  termline *line;
  wchar_t y;
  pos pVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  undefined7 in_register_00000031;
  wchar_t wVar6;
  bool bVar7;
  wchar_t wVar8;
  wchar_t y_00;
  
  if ((int)CONCAT71(in_register_00000031,line_only) == 0) {
    wVar2 = term->rows;
    y_00 = L'\0';
  }
  else {
    y_00 = (term->curs).y;
    wVar2 = y_00 + L'\x01';
  }
  pVar3 = term->curs;
  wVar4 = pVar3.x;
  if (from_begin) {
    wVar6 = L'\0';
    wVar8 = L'\0';
    if (!to_end) {
LAB_0011089e:
      wVar2 = pVar3.y;
      if (wVar4 == term->cols) {
        wVar2 = wVar2 + L'\x01';
        wVar5 = L'\0';
        y = wVar2;
        wVar4 = L'\0';
      }
      else {
        wVar5 = wVar4 + L'\x01';
        y = wVar2;
        wVar4 = wVar5;
      }
      goto LAB_001108b8;
    }
  }
  else {
    y_00 = pVar3.y;
    if (term->wrapnext == true) {
      if (term->cols == wVar4) {
        y_00 = y_00 + L'\x01';
        wVar4 = L'\0';
      }
      else {
        wVar4 = wVar4 + L'\x01';
      }
    }
    wVar6 = wVar4;
    if (!to_end) {
      pVar3.x = L'\0';
      pVar3.y = y_00;
      goto LAB_0011089e;
    }
    wVar8 = L'\0';
    wVar5 = L'\0';
    y = y_00;
    if (from_begin) goto LAB_001108c0;
LAB_001108b8:
    check_boundary(term,wVar4,y);
    wVar8 = wVar5;
  }
LAB_001108c0:
  wVar4 = (term->selend).y;
  bVar7 = wVar6 < (term->selend).x;
  if (y_00 != wVar4) {
    bVar7 = y_00 < wVar4;
  }
  if (bVar7) {
    wVar4 = (term->selstart).y;
    bVar7 = (term->selstart).x < wVar8;
    if (wVar2 != wVar4) {
      bVar7 = wVar4 < wVar2;
    }
    if (bVar7) {
      term->selstate = LEXICOGRAPHIC;
      (term->selstart).y = L'\0';
      (term->selstart).x = L'\0';
      (term->selend).y = L'\0';
      (term->selend).x = L'\0';
    }
  }
  if (y_00 == L'\0' && wVar6 == L'\0') {
    if (wVar2 == term->rows) {
      term_invalidate(term);
    }
    bVar7 = !line_only && wVar8 == L'\0';
    if ((bVar7) && (term->erase_to_scrollback != false)) {
      if (wVar2 == term->rows) {
        wVar2 = find_last_nonempty_line(term,term->screen);
        wVar2 = wVar2 + L'\x01';
      }
      if (L'\0' < wVar2) {
        scroll(term,L'\0',wVar2 + L'\xffffffff',wVar2,true);
      }
      goto LAB_00110ac9;
    }
  }
  else {
    bVar7 = false;
  }
  line = lineptr(term,y_00,L'ହ',L'\x01');
  if (line->trusted != term->trusted) {
    clear_line(term,line);
    line->trusted = term->trusted;
  }
  bVar1 = y_00 < wVar2;
  if (y_00 == wVar2) {
    bVar1 = wVar6 < wVar8;
  }
  if (bVar1) {
    do {
      wVar4 = term->cols;
      if (wVar4 != line->cols) {
        resizeline(term,line,wVar4);
        wVar4 = term->cols;
      }
      if (wVar6 == wVar4) {
        wVar4 = wVar6;
        if (line_only) {
          *(byte *)&line->lattr = (byte)line->lattr & 0xcf;
        }
        else {
          line->lattr = 0;
        }
      }
      else {
        copy_termchar(line,wVar6,&term->erase_char);
        wVar4 = term->cols;
      }
      if (wVar6 == wVar4) {
        y_00 = y_00 + L'\x01';
        wVar6 = L'\0';
        if ((y_00 < term->rows) &&
           (line = lineptr(term,y_00,L'୆',L'\x01'), line->trusted != term->trusted)) {
          clear_line(term,line);
          line->trusted = term->trusted;
        }
      }
      else {
        wVar6 = wVar6 + L'\x01';
      }
      bVar1 = y_00 < wVar2;
      if (y_00 == wVar2) {
        bVar1 = wVar6 < wVar8;
      }
    } while (bVar1);
  }
LAB_00110ac9:
  if ((bVar7) && (term->alt_which == L'\0')) {
    term->tempsblines = L'\0';
  }
  return;
}

Assistant:

static void erase_lots(Terminal *term,
                       bool line_only, bool from_begin, bool to_end)
{
    pos start, end;
    bool erase_lattr;
    bool erasing_lines_from_top = false;

    if (line_only) {
        start.y = term->curs.y;
        start.x = 0;
        end.y = term->curs.y + 1;
        end.x = 0;
        erase_lattr = false;
    } else {
        start.y = 0;
        start.x = 0;
        end.y = term->rows;
        end.x = 0;
        erase_lattr = true;
    }

    /* This is the endpoint of the clearing operation that is not
     * either the start or end of the line / screen. */
    pos boundary = term->curs;

    if (!from_begin) {
        /*
         * If we're erasing from the current char to the end of
         * line/screen, then we take account of wrapnext, so as to
         * maintain the invariant that writing a printing character
         * followed by ESC[K should not overwrite the character you
         * _just wrote_. That is, when wrapnext says the cursor is
         * 'logically' at the very rightmost edge of the screen
         * instead of just before the last printing char, ESC[K should
         * do nothing at all, and ESC[J should clear the next line but
         * leave this one unchanged.
         *
         * This adjusted position will also be the position we use for
         * check_boundary (i.e. the thing we ensure isn't in the
         * middle of a double-width printing char).
         */
        if (term->wrapnext)
            incpos(boundary);

        start = boundary;
    }
    if (!to_end) {
        /*
         * If we're erasing from the start of (at least) the line _to_
         * the current position, then that is taken to mean 'inclusive
         * of the cell under the cursor', which means we don't
         * consider wrapnext at all: whether it's set or not, we still
         * clear the cell under the cursor.
         *
         * Again, that incremented boundary position is where we
         * should be careful of a straddling wide character.
         */
        incpos(boundary);
        end = boundary;
    }
    if (!from_begin || !to_end)
        check_boundary(term, boundary.x, boundary.y);
    check_selection(term, start, end);

    /* Clear screen also forces a full window redraw, just in case. */
    if (start.y == 0 && start.x == 0 && end.y == term->rows)
        term_invalidate(term);

    /* Lines scrolled away shouldn't be brought back on if the terminal
     * resizes. */
    if (start.y == 0 && start.x == 0 && end.x == 0 && erase_lattr)
        erasing_lines_from_top = true;

    if (term->erase_to_scrollback && erasing_lines_from_top) {
        /* If it's a whole number of lines, starting at the top, and
         * we're fully erasing them, erase by scrolling and keep the
         * lines in the scrollback. */
        int scrolllines = end.y;
        if (end.y == term->rows) {
            /* Shrink until we find a non-empty row.*/
            scrolllines = find_last_nonempty_line(term, term->screen) + 1;
        }
        if (scrolllines > 0)
            scroll(term, 0, scrolllines - 1, scrolllines, true);
    } else {
        termline *ldata = scrlineptr(start.y);
        check_trust_status(term, ldata);
        while (poslt(start, end)) {
            check_line_size(term, ldata);
            if (start.x == term->cols) {
                if (!erase_lattr)
                    ldata->lattr &= ~(LATTR_WRAPPED | LATTR_WRAPPED2);
                else
                    ldata->lattr = LATTR_NORM;
            } else {
                copy_termchar(ldata, start.x, &term->erase_char);
            }
            if (incpos(start) && start.y < term->rows) {
                ldata = scrlineptr(start.y);
                check_trust_status(term, ldata);
            }
        }
    }

    /* After an erase of lines from the top of the screen, we shouldn't
     * bring the lines back again if the terminal enlarges (since the user or
     * application has explicitly thrown them away). */
    if (erasing_lines_from_top && !(term->alt_which))
        term->tempsblines = 0;
}